

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

iterator * __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_char32_t,_char16_t>
::iterator::operator++(iterator *this)

{
  __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  last;
  byte bVar1;
  code_point u;
  encoded_chars<char16_t> eVar2;
  
  bVar1 = this->idx_ + 1;
  this->idx_ = bVar1;
  if (((this->next_chars_).size_ == (uint)bVar1) &&
     (last._M_current = (this->last_)._M_current, (this->first_)._M_current != last._M_current)) {
    u = utf_traits<char32_t,4>::
        decode<__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>>
                  (&this->first_,last);
    eVar2 = utf_traits<char16_t,_2>::encode(u);
    this->next_chars_ = eVar2;
    this->idx_ = '\0';
  }
  return this;
}

Assistant:

TCB_CONSTEXPR14 iterator& operator++()
        {
            if (++idx_ == next_chars_.size() && first_ != last_) {
                char32_t c = utf_traits<InCharT>::decode(first_, last_);
                next_chars_ = utf_traits<OutCharT>::encode(c);
                idx_ = 0;
            }
            return *this;
        }